

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSubSimplexConvexCast.cpp
# Opt level: O2

bool __thiscall
cbtSubsimplexConvexCast::calcTimeOfImpact
          (cbtSubsimplexConvexCast *this,cbtTransform *fromA,cbtTransform *toA,cbtTransform *fromB,
          cbtTransform *toB,CastResult *result)

{
  cbtConvexShape *pcVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  CastResult *pCVar5;
  bool bVar6;
  int iVar7;
  undefined1 auVar8 [16];
  float fVar9;
  cbtScalar cVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar27 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  cbtScalar acVar12 [4];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 extraout_var [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar14 [16];
  undefined1 extraout_var_01 [56];
  undefined1 auVar26 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar28 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar46 [16];
  cbtVector3 cVar47;
  undefined1 auVar48 [16];
  cbtVector3 cVar49;
  cbtVector3 r;
  cbtVector3 hitB;
  cbtVector3 hitA;
  cbtTransform interpolatedTransB;
  cbtTransform interpolatedTransA;
  undefined1 local_1a8 [16];
  cbtVector3 local_198;
  undefined1 local_188 [16];
  CastResult *local_170;
  cbtVector3 local_168;
  cbtVector3 local_158;
  cbtVector3 local_148;
  cbtVector3 local_138;
  cbtVector3 *local_128;
  cbtVector3 *local_120;
  cbtVector3 *local_118;
  cbtVector3 *local_110;
  cbtVector3 local_108;
  cbtVector3 local_f8;
  cbtVector3 local_e8;
  undefined1 local_d8 [16];
  cbtVector3 local_c8;
  cbtTransform local_b8;
  cbtTransform local_78;
  undefined1 auVar21 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar39 [64];
  undefined1 auVar45 [56];
  undefined1 extraout_var_03 [56];
  
  auVar45 = in_ZMM1._8_56_;
  auVar27 = in_ZMM0._8_56_;
  local_170 = result;
  cbtVoronoiSimplexSolver::reset(this->m_simplexSolver);
  local_118 = &toA->m_origin;
  local_120 = &fromA->m_origin;
  cVar47 = ::operator-(local_118,local_120);
  auVar31._0_8_ = cVar47.m_floats._8_8_;
  auVar31._8_56_ = auVar45;
  auVar37._0_8_ = cVar47.m_floats._0_8_;
  auVar37._8_56_ = auVar27;
  local_110 = &toB->m_origin;
  local_128 = &fromB->m_origin;
  local_188 = auVar37._0_16_;
  cVar47 = ::operator-(local_110,local_128);
  auVar32._0_8_ = cVar47.m_floats._8_8_;
  auVar32._8_56_ = auVar45;
  auVar15._0_8_ = cVar47.m_floats._0_8_;
  auVar15._8_56_ = auVar27;
  local_78.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(fromA->m_basis).m_el[0].m_floats;
  local_78.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((fromA->m_basis).m_el[0].m_floats + 2);
  local_78.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(fromA->m_basis).m_el[1].m_floats;
  local_78.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((fromA->m_basis).m_el[1].m_floats + 2);
  local_78.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(fromA->m_basis).m_el[2].m_floats;
  local_78.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((fromA->m_basis).m_el[2].m_floats + 2);
  local_78.m_origin.m_floats._0_8_ = *(undefined8 *)(fromA->m_origin).m_floats;
  local_78.m_origin.m_floats._8_8_ = *(undefined8 *)((fromA->m_origin).m_floats + 2);
  local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(fromB->m_basis).m_el[0].m_floats;
  local_b8.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((fromB->m_basis).m_el[0].m_floats + 2);
  local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(fromB->m_basis).m_el[1].m_floats;
  local_b8.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((fromB->m_basis).m_el[1].m_floats + 2);
  local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(fromB->m_basis).m_el[2].m_floats;
  local_b8.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((fromB->m_basis).m_el[2].m_floats + 2);
  local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)(fromB->m_origin).m_floats;
  local_b8.m_origin.m_floats._8_8_ = *(undefined8 *)((fromB->m_origin).m_floats + 2);
  auVar48 = vsubps_avx(local_188,auVar15._0_16_);
  auVar8 = vsubps_avx(auVar31._0_16_,auVar32._0_16_);
  local_158.m_floats = (cbtScalar  [4])vinsertps_avx(auVar48,auVar8,0x28);
  auVar11._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
  auVar11._8_4_ = auVar48._8_4_ ^ 0x80000000;
  auVar11._12_4_ = auVar48._12_4_ ^ 0x80000000;
  auVar28._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
  auVar28._8_4_ = auVar8._8_4_ ^ 0x80000000;
  auVar28._12_4_ = auVar8._12_4_ ^ 0x80000000;
  auVar45 = ZEXT856(auVar28._8_8_);
  local_148.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,auVar28,0x28);
  auVar27 = ZEXT856(local_148.m_floats._8_8_);
  pcVar1 = this->m_convexA;
  cVar47 = ::operator*(&local_148,&fromA->m_basis);
  auVar33._0_8_ = cVar47.m_floats._8_8_;
  auVar33._8_56_ = auVar45;
  auVar16._0_8_ = cVar47.m_floats._0_8_;
  auVar16._8_56_ = auVar27;
  acVar12 = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar33._0_16_);
  local_138.m_floats = acVar12;
  (*(pcVar1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])(pcVar1,&local_138);
  auVar45 = auVar33._8_56_;
  local_198.m_floats = (cbtScalar  [4])vmovlhps_avx(acVar12,auVar33._0_16_);
  auVar27 = ZEXT856(local_198.m_floats._8_8_);
  cVar47 = cbtTransform::operator()(fromA,&local_198);
  pCVar5 = local_170;
  auVar34._0_8_ = cVar47.m_floats._8_8_;
  auVar34._8_56_ = auVar45;
  auVar17._0_8_ = cVar47.m_floats._0_8_;
  auVar17._8_56_ = auVar27;
  local_d8 = auVar17._0_16_;
  local_168.m_floats = (cbtScalar  [4])vmovlhps_avx(local_d8,auVar34._0_16_);
  local_188._0_8_ = this;
  pcVar1 = this->m_convexB;
  cVar47 = ::operator*(&local_158,&fromB->m_basis);
  auVar35._0_8_ = cVar47.m_floats._8_8_;
  auVar35._8_56_ = auVar45;
  auVar18._0_8_ = cVar47.m_floats._0_8_;
  auVar18._8_56_ = auVar27;
  acVar12 = (cbtScalar  [4])vmovlhps_avx(auVar18._0_16_,auVar35._0_16_);
  local_148.m_floats = acVar12;
  (*(pcVar1->super_cbtCollisionShape)._vptr_cbtCollisionShape[0x10])(pcVar1,&local_148);
  auVar45 = auVar35._8_56_;
  local_198.m_floats = (cbtScalar  [4])vmovlhps_avx(acVar12,auVar35._0_16_);
  auVar27 = ZEXT856(local_198.m_floats._8_8_);
  cVar47 = cbtTransform::operator()(fromB,&local_198);
  auVar36._0_8_ = cVar47.m_floats._8_8_;
  auVar36._8_56_ = auVar45;
  auVar19._0_8_ = cVar47.m_floats._0_8_;
  auVar19._8_56_ = auVar27;
  local_138.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar19._0_16_,auVar36._0_16_);
  auVar48 = vsubps_avx(local_d8,auVar19._0_16_);
  auVar8 = vsubps_avx(auVar34._0_16_,auVar36._0_16_);
  local_198.m_floats = (cbtScalar  [4])vinsertps_avx(auVar48,auVar8,0x28);
  local_148.m_floats = (cbtScalar  [4])(ZEXT816(0) << 0x20);
  iVar7 = pCVar5->m_subSimplexCastMaxIterations;
  fVar9 = cbtVector3::length2(&local_198);
  auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
  local_1a8._4_12_ = auVar34._4_12_;
  auVar48._12_4_ = 0;
  auVar48._0_12_ = local_1a8._4_12_;
  local_1a8 = auVar48 << 0x20;
  while( true ) {
    auVar27 = auVar37._8_56_;
    if ((fVar9 <= pCVar5->m_subSimplexCastEpsilon) || (iVar7 == 0)) break;
    local_170 = (CastResult *)CONCAT44(local_170._4_4_,iVar7 + -1);
    uVar4 = local_188._0_8_;
    plVar2 = *(long **)(local_188._0_8_ + 0x10);
    auVar8._0_8_ = local_198.m_floats._0_8_ ^ 0x8000000080000000;
    auVar8._8_4_ = 0x80000000;
    auVar8._12_4_ = 0x80000000;
    auVar29._0_4_ = -local_198.m_floats[2];
    auVar29._4_4_ = 0x80000000;
    auVar29._8_4_ = 0x80000000;
    auVar29._12_4_ = 0x80000000;
    auVar45 = ZEXT856(auVar29._8_8_);
    local_c8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar8,auVar29,0x28);
    auVar27 = ZEXT856(local_c8.m_floats._8_8_);
    cVar47 = ::operator*(&local_c8,&local_78.m_basis);
    auVar38._0_8_ = cVar47.m_floats._8_8_;
    auVar38._8_56_ = auVar45;
    auVar20._0_8_ = cVar47.m_floats._0_8_;
    auVar20._8_56_ = auVar27;
    local_108.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar20._0_16_,auVar38._0_16_);
    auVar48 = (**(code **)(*plVar2 + 0x80))(plVar2,&local_108);
    auVar39._0_8_ = auVar48._8_8_;
    auVar21._0_8_ = auVar48._0_8_;
    auVar39._8_56_ = extraout_var_02;
    auVar21._8_56_ = extraout_var;
    local_f8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar21._0_16_,auVar39._0_16_);
    auVar45 = ZEXT856(local_f8.m_floats._8_8_);
    auVar27 = extraout_var_02;
    cVar47 = cbtTransform::operator()(&local_78,&local_f8);
    auVar40._0_8_ = cVar47.m_floats._8_8_;
    auVar40._8_56_ = auVar27;
    auVar22._0_8_ = cVar47.m_floats._0_8_;
    auVar22._8_56_ = auVar45;
    local_168.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar22._0_16_,auVar40._0_16_);
    auVar45 = ZEXT856(local_168.m_floats._8_8_);
    plVar2 = *(long **)(uVar4 + 0x18);
    cVar47 = ::operator*(&local_198,&local_b8.m_basis);
    auVar41._0_8_ = cVar47.m_floats._8_8_;
    auVar41._8_56_ = auVar27;
    auVar23._0_8_ = cVar47.m_floats._0_8_;
    auVar23._8_56_ = auVar45;
    local_108.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar23._0_16_,auVar41._0_16_);
    auVar48 = (**(code **)(*plVar2 + 0x80))(plVar2,&local_108);
    auVar42._0_8_ = auVar48._8_8_;
    auVar24._0_8_ = auVar48._0_8_;
    auVar42._8_56_ = extraout_var_03;
    auVar24._8_56_ = extraout_var_00;
    local_f8.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar24._0_16_,auVar42._0_16_);
    auVar45 = ZEXT856(local_f8.m_floats._8_8_);
    auVar27 = extraout_var_03;
    cVar49 = cbtTransform::operator()(&local_b8,&local_f8);
    cVar47.m_floats = local_168.m_floats;
    auVar43._0_8_ = cVar49.m_floats._8_8_;
    auVar43._8_56_ = auVar27;
    auVar25._0_8_ = cVar49.m_floats._0_8_;
    auVar25._8_56_ = auVar45;
    local_138.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar25._0_16_,auVar43._0_16_);
    auVar46._8_8_ = 0;
    auVar46._0_4_ = local_168.m_floats[0];
    auVar46._4_4_ = local_168.m_floats[1];
    auVar48 = vsubps_avx(auVar46,auVar25._0_16_);
    local_168.m_floats[2] = cVar47.m_floats[2];
    auVar8 = ZEXT416((uint)(local_168.m_floats[2] - cVar49.m_floats[2]));
    local_e8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar48,auVar8,0x28);
    if (1.0 < (float)local_1a8._0_4_) goto LAB_00e08f45;
    auVar37 = ZEXT464((uint)local_198.m_floats[0]);
    auVar11 = vmovshdup_avx(auVar48);
    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(local_198.m_floats[1] * auVar11._0_4_)),
                              ZEXT416((uint)local_198.m_floats[0]),auVar48);
    auVar48 = vfmadd213ss_fma(auVar8,ZEXT416((uint)local_198.m_floats[2]),auVar48);
    local_168.m_floats = cVar47.m_floats;
    if (0.0 < auVar48._0_4_) {
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_198.m_floats[1] * local_158.m_floats[1])),
                               ZEXT416((uint)local_198.m_floats[0]),
                               ZEXT416((uint)local_158.m_floats[0]));
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_198.m_floats[2]),
                               ZEXT416((uint)local_158.m_floats[2]));
      if (-1.4210855e-14 <= auVar8._0_4_) goto LAB_00e08f45;
      fVar9 = (float)local_1a8._0_4_ - auVar48._0_4_ / auVar8._0_4_;
      local_1a8._0_4_ = fVar9;
      cbtVector3::setInterpolate3(&local_78.m_origin,local_120,local_118,fVar9);
      cbtVector3::setInterpolate3(&local_b8.m_origin,local_128,local_110,fVar9);
      cVar49.m_floats = local_138.m_floats;
      cVar47.m_floats = local_168.m_floats;
      auVar13._8_8_ = 0;
      auVar13._0_4_ = local_168.m_floats[0];
      auVar13._4_4_ = local_168.m_floats[1];
      auVar30._8_8_ = 0;
      auVar30._0_4_ = local_138.m_floats[0];
      auVar30._4_4_ = local_138.m_floats[1];
      auVar48 = vsubps_avx(auVar13,auVar30);
      local_168.m_floats[2] = cVar47.m_floats[2];
      local_138.m_floats[2] = cVar49.m_floats[2];
      local_e8.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar48,ZEXT416((uint)(local_168.m_floats[2] - local_138.m_floats[2])),0x28
                        );
      auVar37 = ZEXT1664((undefined1  [16])local_198.m_floats);
      local_148.m_floats[0] = local_198.m_floats[0];
      local_148.m_floats[1] = local_198.m_floats[1];
      local_148.m_floats[2] = local_198.m_floats[2];
      local_148.m_floats[3] = local_198.m_floats[3];
      local_168.m_floats = cVar47.m_floats;
      local_138.m_floats = cVar49.m_floats;
    }
    bVar6 = cbtVoronoiSimplexSolver::inSimplex
                      (*(cbtVoronoiSimplexSolver **)(local_188._0_8_ + 8),&local_e8);
    iVar7 = (int)local_170;
    if (!bVar6) {
      cbtVoronoiSimplexSolver::addVertex
                (*(cbtVoronoiSimplexSolver **)(local_188._0_8_ + 8),&local_e8,&local_168,&local_138)
      ;
    }
    bVar6 = cbtVoronoiSimplexSolver::closest
                      (*(cbtVoronoiSimplexSolver **)(local_188._0_8_ + 8),&local_198);
    fVar9 = 0.0;
    if (bVar6) {
      fVar9 = cbtVector3::length2(&local_198);
    }
  }
  pCVar5->m_fraction = (cbtScalar)local_1a8._0_4_;
  cVar10 = cbtVector3::length2(&local_148);
  if (1.4210855e-14 <= cVar10) {
    auVar45 = extraout_var_01;
    cVar47 = cbtVector3::normalized(&local_148);
    auVar44._0_8_ = cVar47.m_floats._8_8_;
    auVar44._8_56_ = auVar27;
    auVar26._0_8_ = cVar47.m_floats._0_8_;
    auVar26._8_56_ = auVar45;
    auVar8 = auVar26._0_16_;
    auVar11 = auVar44._0_16_;
    auVar48 = vmovlhps_avx(auVar8,auVar11);
    *(undefined1 (*) [16])(pCVar5->m_normal).m_floats = auVar48;
    auVar48 = vmovshdup_avx(auVar8);
    fVar9 = auVar48._0_4_;
  }
  else {
    auVar14._0_12_ = ZEXT812(0);
    auVar14._12_4_ = 0;
    auVar11 = ZEXT816(0) << 0x40;
    fVar9 = 0.0;
    *(undefined1 (*) [16])(pCVar5->m_normal).m_floats = auVar14;
    auVar8 = ZEXT416(0) << 0x20;
  }
  auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * local_158.m_floats[1])),auVar8,
                            ZEXT416((uint)local_158.m_floats[0]));
  auVar3._8_4_ = 0x80000000;
  auVar3._0_8_ = 0x8000000080000000;
  auVar3._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(ZEXT416((uint)pCVar5->m_allowedPenetration),auVar3);
  auVar48 = vfmadd231ss_fma(auVar48,auVar11,ZEXT416((uint)local_158.m_floats[2]));
  if (auVar8._0_4_ <= auVar48._0_4_) {
LAB_00e08f45:
    bVar6 = false;
  }
  else {
    cbtVoronoiSimplexSolver::compute_points
              (*(cbtVoronoiSimplexSolver **)(local_188._0_8_ + 8),&local_f8,&local_108);
    bVar6 = true;
    *(undefined8 *)(pCVar5->m_hitPoint).m_floats = local_108.m_floats._0_8_;
    *(undefined8 *)((pCVar5->m_hitPoint).m_floats + 2) = local_108.m_floats._8_8_;
  }
  return bVar6;
}

Assistant:

bool cbtSubsimplexConvexCast::calcTimeOfImpact(
	const cbtTransform& fromA,
	const cbtTransform& toA,
	const cbtTransform& fromB,
	const cbtTransform& toB,
	CastResult& result)
{
	m_simplexSolver->reset();

	cbtVector3 linVelA, linVelB;
	linVelA = toA.getOrigin() - fromA.getOrigin();
	linVelB = toB.getOrigin() - fromB.getOrigin();

	cbtScalar lambda = cbtScalar(0.);

	cbtTransform interpolatedTransA = fromA;
	cbtTransform interpolatedTransB = fromB;

	///take relative motion
	cbtVector3 r = (linVelA - linVelB);
	cbtVector3 v;

	cbtVector3 supVertexA = fromA(m_convexA->localGetSupportingVertex(-r * fromA.getBasis()));
	cbtVector3 supVertexB = fromB(m_convexB->localGetSupportingVertex(r * fromB.getBasis()));
	v = supVertexA - supVertexB;
	int maxIter = result.m_subSimplexCastMaxIterations;

	cbtVector3 n;
	n.setValue(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));

	cbtVector3 c;

	cbtScalar dist2 = v.length2();



	cbtVector3 w, p;
	cbtScalar VdotR;

	while ((dist2 > result.m_subSimplexCastEpsilon) && maxIter--)
	{
		supVertexA = interpolatedTransA(m_convexA->localGetSupportingVertex(-v * interpolatedTransA.getBasis()));
		supVertexB = interpolatedTransB(m_convexB->localGetSupportingVertex(v * interpolatedTransB.getBasis()));
		w = supVertexA - supVertexB;

		cbtScalar VdotW = v.dot(w);

		if (lambda > cbtScalar(1.0))
		{
			return false;
		}

		if (VdotW > cbtScalar(0.))
		{
			VdotR = v.dot(r);

			if (VdotR >= -(SIMD_EPSILON * SIMD_EPSILON))
				return false;
			else
			{
				lambda = lambda - VdotW / VdotR;
				//interpolate to next lambda
				//	x = s + lambda * r;
				interpolatedTransA.getOrigin().setInterpolate3(fromA.getOrigin(), toA.getOrigin(), lambda);
				interpolatedTransB.getOrigin().setInterpolate3(fromB.getOrigin(), toB.getOrigin(), lambda);
				//m_simplexSolver->reset();
				//check next line
				w = supVertexA - supVertexB;

				n = v;
			}
		}
		///Just like regular GJK only add the vertex if it isn't already (close) to current vertex, it would lead to divisions by zero and NaN etc.
		if (!m_simplexSolver->inSimplex(w))
			m_simplexSolver->addVertex(w, supVertexA, supVertexB);

		if (m_simplexSolver->closest(v))
		{
			dist2 = v.length2();

			//todo: check this normal for validity
			//n=v;
			//printf("V=%f , %f, %f\n",v[0],v[1],v[2]);
			//printf("DIST2=%f\n",dist2);
			//printf("numverts = %i\n",m_simplexSolver->numVertices());
		}
		else
		{
			dist2 = cbtScalar(0.);
		}
	}

	//int numiter = MAX_ITERATIONS - maxIter;
	//	printf("number of iterations: %d", numiter);

	//don't report a time of impact when moving 'away' from the hitnormal

	result.m_fraction = lambda;
	if (n.length2() >= (SIMD_EPSILON * SIMD_EPSILON))
		result.m_normal = n.normalized();
	else
		result.m_normal = cbtVector3(cbtScalar(0.0), cbtScalar(0.0), cbtScalar(0.0));

	//don't report time of impact for motion away from the contact normal (or causes minor penetration)
	if (result.m_normal.dot(r) >= -result.m_allowedPenetration)
		return false;

	cbtVector3 hitA, hitB;
	m_simplexSolver->compute_points(hitA, hitB);
	result.m_hitPoint = hitB;
	return true;
}